

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall slang::ast::Scope::elaborate(Scope *this)

{
  string_view *key;
  SymbolKind SVar1;
  SyntaxKind SVar2;
  SyntaxNode *pSVar3;
  Compilation *pCVar4;
  Symbol *pSVar5;
  Symbol *pSVar6;
  ForwardingTypedefSymbol *pFVar7;
  SymbolMap *pSVar8;
  size_type sVar9;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  portDeclarations;
  anon_class_8_1_8991fb9c aVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  DeferredMemberData *pDVar16;
  DeclaredType *this_00;
  Type *pTVar17;
  EnumType *pEVar18;
  EnumValueSymbol *args;
  TransparentMemberSymbol *pTVar19;
  EnumTypeSyntax *syntax;
  ClassType *pCVar20;
  PortSymbol *this_01;
  InstanceBodySymbol *pIVar21;
  undefined4 extraout_var;
  BindDirectiveSyntax *syntax_00;
  ClockingItemSyntax *syntax_01;
  DefaultDisableDeclarationSyntax *pDVar22;
  ExpressionSyntax *pEVar23;
  Expression *expr;
  HierarchyInstantiationSyntax *syntax_02;
  DefaultClockingReferenceSyntax *syntax_03;
  LoopGenerateSyntax *syntax_04;
  GenerateBlockArraySymbol *member;
  PrimitiveInstantiationSyntax *syntax_05;
  GenerateBlockSyntax *syntax_06;
  GenerateBlockSymbol *member_00;
  ContinuousAssignSyntax *syntax_07;
  IfGenerateSyntax *syntax_08;
  DataDeclarationSyntax *pDVar24;
  ModportDeclarationSyntax *syntax_09;
  CaseGenerateSyntax *syntax_10;
  ModuleDeclarationSyntax *syntax_11;
  iterator iVar25;
  TypeAliasType *this_02;
  GenericClassDefSymbol *this_03;
  Diagnostic *pDVar26;
  StatementBlockSymbol *this_04;
  PortDeclarationSyntax *pPVar27;
  DeclaratorSyntax *this_05;
  logic_error *this_06;
  Symbol *pSVar28;
  Symbol *pSVar29;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Symbol **ppSVar30;
  long lVar31;
  pointer ppVar32;
  pointer ppSVar33;
  Symbol *pSVar34;
  pointer ppFVar35;
  TransparentMemberSymbol *at;
  iterator __begin3;
  long lVar36;
  pointer ppVar37;
  undefined8 *puVar38;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar39;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB_00;
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar40;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_> iVar41;
  LookupLocation LVar42;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar43;
  string_view sVar44;
  SourceRange sourceRange;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  LookupLocation lookupLocation;
  undefined8 in_stack_fffffffffffffcd8;
  uint32_t uVar45;
  uint32_t constructIndex;
  undefined4 uVar46;
  undefined4 uVar47;
  char *local_318;
  allocator<char> local_309;
  pointer local_308;
  anon_class_8_1_8991fb9c insertMembers;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
  observedForwardDecls;
  anon_class_8_1_8991fb9c insertMembersAndNets;
  ASTContext context;
  ASTContext context_1;
  DeferredMemberData deferredData;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  enumDecls;
  undefined4 extraout_var_00;
  
  if ((this->thisSym->kind == InstanceBody) && (TimeTrace::profiler != 0)) {
    detail.callable = (intptr_t)&enumDecls;
    detail.callback =
         function_ref<std::__cxx11::string()>::callback_fn<slang::ast::Scope::elaborate()const::__2>
    ;
    sVar44._M_str = "elaborate scope";
    sVar44._M_len = 0xf;
    enumDecls.
    super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
    .buffer._0_8_ = this;
    TimeTrace::beginTrace(sVar44,detail);
  }
  if (this->deferredMemberIndex == Invalid) {
    assert::assertFailed
              ("deferredMemberIndex != DeferredMemberIndex::Invalid",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
               ,0x326,"void slang::ast::Scope::elaborate() const");
  }
  pDVar16 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
  DeferredMemberData::DeferredMemberData(&deferredData,pDVar16);
  this->deferredMemberIndex = Invalid;
  SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  ::SmallSet(&enumDecls);
  local_318 = "type->kind == SymbolKind::ErrorType";
  uVar45 = (uint32_t)
           deferredData.transparentTypes.
           super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar46 = (undefined4)
           ((ulong)deferredData.transparentTypes.
                   super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
  ppVar32 = deferredData.transparentTypes.
            super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar37 = deferredData.transparentTypes.
                 super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar37 != ppVar32;
      ppVar37 = ppVar37 + 1) {
    at = (TransparentMemberSymbol *)ppVar37->first;
    this_00 = Symbol::getDeclaredType(ppVar37->second);
    pTVar17 = DeclaredType::getType(this_00);
    while (bVar12 = Type::isPackedArray(pTVar17), bVar12) {
      pTVar17 = Type::getArrayElementType(pTVar17);
    }
    SVar1 = (pTVar17->super_Symbol).kind;
    if (SVar1 == EnumType) {
      pSVar3 = (pTVar17->super_Symbol).originatingSyntax;
      if ((pSVar3 == (SyntaxNode *)0x0) ||
         (observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer._0_8_ = pSVar3,
         pVar40 = ska::detailv3::
                  sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                  ::emplace<slang::syntax::SyntaxNode_const*>
                            ((sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                              *)&enumDecls.
                                 super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                             ,(SyntaxNode **)&observedForwardDecls),
         ((undefined1  [16])pVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        pEVar18 = Symbol::as<slang::ast::EnumType>(&pTVar17->super_Symbol);
        iVar41 = membersOfType<slang::ast::EnumValueSymbol>(&pEVar18->super_Scope);
        observedForwardDecls.
        super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
        .buffer._0_8_ = iVar41.m_begin.current;
        while ((Symbol *)
               observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer._0_8_ != iVar41.m_end.current.current) {
          args = Symbol::as<slang::ast::EnumValueSymbol>
                           ((Symbol *)
                            observedForwardDecls.
                            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                            .buffer._0_8_);
          pTVar19 = BumpAllocator::
                    emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol_const&>
                              (&this->compilation->super_BumpAllocator,args);
          insertMember(this,&pTVar19->super_Symbol,&at->super_Symbol,true,false);
          specific_symbol_iterator<slang::ast::EnumValueSymbol>::operator++
                    ((specific_symbol_iterator<slang::ast::EnumValueSymbol> *)&observedForwardDecls)
          ;
          at = pTVar19;
        }
      }
    }
    else {
      iVar15 = 0x341;
      if ((*(int *)&this_00->field_0x3c < 0) ||
         (pSVar3 = (SyntaxNode *)(this_00->typeOrLink).typeSyntax, pSVar3 == (SyntaxNode *)0x0)) {
        local_318 = "syntax";
LAB_0022b6a7:
        assert::assertFailed
                  (local_318,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                   ,iVar15,"void slang::ast::Scope::elaborate() const");
      }
      if (SVar1 != ErrorType) {
        iVar15 = 0x342;
        goto LAB_0022b6a7;
      }
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer._0_8_ =
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer + 0x18;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[8] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[9] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[10] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xb] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xc] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xd] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xe] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xf] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x10] = '\x05';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x11] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x12] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x13] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x14] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x15] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x16] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x17] = '\0';
      LVar42._12_4_ = 0;
      LVar42.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
      LVar42.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
      local_308 = ppVar37;
      ASTContext::ASTContext(&context,this,LVar42,(bitmask<slang::ast::ASTFlags>)0x0);
      syntax = slang::syntax::SyntaxNode::as<slang::syntax::EnumTypeSyntax>(pSVar3);
      EnumType::createDefaultMembers
                (&context,syntax,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls);
      uVar11 = observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer._0_8_;
      lVar31 = observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer._8_8_ << 3;
      for (lVar36 = 0; lVar31 != lVar36; lVar36 = lVar36 + 8) {
        pTVar19 = *(TransparentMemberSymbol **)(uVar11 + lVar36);
        insertMember(this,&pTVar19->super_Symbol,&at->super_Symbol,true,false);
        at = pTVar19;
      }
      SmallVectorBase<const_slang::ast::Symbol_*>::~SmallVectorBase
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls);
      ppVar32 = (pointer)CONCAT44(uVar46,uVar45);
      ppVar37 = local_308;
    }
  }
  local_308 = (pointer)deferredData.members.
                       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  pSVar34 = this->thisSym;
  if (pSVar34->kind == InstanceBody) {
    pIVar21 = Symbol::as<slang::ast::InstanceBodySymbol>(pSVar34);
    if (pIVar21->definition->definitionKind == Interface) {
      deferredMembers.size_ =
           (long)local_308 -
           (long)deferredData.members.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      deferredMembers.data_ =
           deferredData.members.
           super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      handleExportedMethods(this,deferredMembers);
    }
  }
  else if (pSVar34->kind == ClassType) {
    pCVar20 = Symbol::as<slang::ast::ClassType>(pSVar34);
    insertCB.callable = (intptr_t)&observedForwardDecls;
    insertCB.callback =
         function_ref<void(slang::ast::Symbol_const&)>::
         callback_fn<slang::ast::Scope::elaborate()const::__3>;
    observedForwardDecls.
    super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
    .buffer._0_8_ = this;
    ClassType::inheritMembers(pCVar20,insertCB);
  }
  bVar12 = false;
  constructIndex = 1;
  bVar13 = false;
  ppSVar33 = deferredData.members.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  insertMembers.this = this;
  insertMembersAndNets.this = this;
  do {
    if ((pointer)ppSVar33 == local_308) {
      ppSVar33 = deferredData.members.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (bVar12) {
        for (; (pointer)ppSVar33 != local_308; ppSVar33 = ppSVar33 + 1) {
          pSVar34 = *ppSVar33;
          Symbol::as<(anonymous_namespace)::DeferredMemberSymbol>(pSVar34);
          pSVar3 = *(SyntaxNode **)(pSVar34 + 1);
          SVar2 = pSVar3->kind;
          if ((SVar2 == ProgramDeclaration) || (SVar2 == ModuleDeclaration)) {
            syntax_11 = slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>
                                  (pSVar3);
            handleNestedDefinition(this,syntax_11);
          }
        }
      }
      if (!bVar13) {
        while (deferredData.portDecls.
               super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               deferredData.portDecls.
               super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          uVar46 = SUB84(deferredData.portDecls.
                         super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,0);
          uVar47 = (undefined4)
                   ((ulong)deferredData.portDecls.
                           super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 0x20);
          pSVar3 = (deferredData.portDecls.
                    super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->first;
          if (pSVar3->kind == PortDeclaration) {
            pPVar27 = slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>(pSVar3);
            pSVar39 = &pPVar27->declarators;
          }
          else {
            pDVar24 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(pSVar3);
            pSVar39 = &pDVar24->declarators;
          }
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[8] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[9] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[10] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xb] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xc] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xd] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xe] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xf] = '\0';
          sVar9 = (pSVar39->elements).size_;
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer._0_8_ = pSVar39;
          while( true ) {
            if (((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
                 observedForwardDecls.
                 super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                 .buffer._0_8_ == pSVar39) &&
               (observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer._8_8_ == sVar9 + 1 >> 1)) goto LAB_0022b686;
            this_05 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                      iterator_base<const_slang::syntax::DeclaratorSyntax_*>::operator*
                                ((iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                                 &observedForwardDecls);
            sVar44 = parsing::Token::valueText(&this_05->name);
            if (sVar44._M_len != 0) break;
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer._8_8_ =
                 observedForwardDecls.
                 super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                 .buffer._8_8_ + 1;
          }
          sourceRange = slang::syntax::SyntaxNode::sourceRange(&this_05->super_SyntaxNode);
          pDVar26 = addDiag(this,(DiagCode)0x990006,sourceRange);
          Diagnostic::operator<<(pDVar26,sVar44);
LAB_0022b686:
          deferredData.portDecls.
          super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(CONCAT44(uVar47,uVar46) + 0x10);
        }
      }
      if (local_308 !=
          (pointer)deferredData.members.
                   super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
        pSVar34 = this->lastMember;
        pSVar28 = (Symbol *)0x0;
        ppSVar30 = &this->firstMember;
        while (pSVar5 = *ppSVar30, pSVar5 != (Symbol *)0x0) {
          pSVar29 = pSVar5;
          if (pSVar5->kind == DeferredMember) {
            pSVar6 = pSVar5->nextInScope;
            ppSVar30 = &pSVar28->nextInScope;
            if (pSVar28 == (Symbol *)0x0) {
              ppSVar30 = &this->firstMember;
            }
            *ppSVar30 = pSVar6;
            pSVar29 = pSVar28;
            if (pSVar34 == pSVar5) {
              this->lastMember = pSVar6;
              pSVar34 = pSVar6;
            }
          }
          pSVar28 = pSVar29;
          ppSVar30 = &pSVar5->nextInScope;
        }
      }
      SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
      ::SmallSet(&observedForwardDecls);
      for (ppFVar35 = deferredData.forwardingTypedefs.
                      super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppFVar35 !=
          deferredData.forwardingTypedefs.
          super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppFVar35 = ppFVar35 + 1) {
        pFVar7 = *ppFVar35;
        if ((pFVar7->super_Symbol).name._M_len != 0) {
          key = &(pFVar7->super_Symbol).name;
          pVar43 = ska::detailv3::
                   sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>>
                   ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                             ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>>
                               *)&observedForwardDecls.
                                  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_4UL>_>
                              ,key);
          if (((undefined1  [16])pVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            iVar25 = ska::detailv3::
                     sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                     ::find(&this->nameMap->
                             super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                            ,key);
            pSVar8 = this->nameMap;
            if (iVar25.current ==
                (pSVar8->
                super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                ).entries +
                (pSVar8->
                super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                ).num_slots_minus_one +
                (long)(pSVar8->
                      super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                      ).max_lookups) {
              assert::assertFailed
                        ("it != nameMap->end()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,0x442,"void slang::ast::Scope::elaborate() const");
            }
            pSVar34 = ((iVar25.current)->field_1).value.second;
            SVar1 = pSVar34->kind;
            if (SVar1 == ClassType) {
              pCVar20 = Symbol::as<slang::ast::ClassType>(pSVar34);
              ClassType::checkForwardDecls(pCVar20);
            }
            else if (SVar1 == GenericClassDef) {
              this_03 = Symbol::as<slang::ast::GenericClassDefSymbol>(pSVar34);
              GenericClassDefSymbol::checkForwardDecls(this_03);
            }
            else if (SVar1 == TypeAlias) {
              this_02 = Symbol::as<slang::ast::TypeAliasType>(pSVar34);
              TypeAliasType::checkForwardDecls(this_02);
            }
            else {
              pDVar26 = addDiag(this,(DiagCode)0x37000a,(pFVar7->super_Symbol).location);
              Diagnostic::operator<<(pDVar26,(pFVar7->super_Symbol).name);
            }
          }
        }
      }
      if (this->thisSym->kind == StatementBlock) {
        context_1.scope.ptr = (Scope *)0x0;
        this_04 = Symbol::as<slang::ast::StatementBlockSymbol>(this->thisSym);
        context._8_8_ = &context_1;
        insertCB_00.callable = (intptr_t)&context;
        insertCB_00.callback =
             function_ref<void(slang::ast::Symbol_const&)>::
             callback_fn<slang::ast::Scope::elaborate()const::__4>;
        context.scope.ptr = this;
        StatementBlockSymbol::elaborateVariables(this_04,insertCB_00);
      }
      if (this->deferredMemberIndex != Invalid) {
        assert::assertFailed
                  ("deferredMemberIndex == DeferredMemberIndex::Invalid",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                   ,0x458,"void slang::ast::Scope::elaborate() const");
      }
      if ((this->thisSym->kind == InstanceBody) && (TimeTrace::profiler != 0)) {
        TimeTrace::endTrace();
      }
      ska::detailv3::
      sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
      ::~sherwood_v3_table
                (&observedForwardDecls.
                  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_4UL>_>
                  .
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
                );
      ska::detailv3::
      sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
      ::~sherwood_v3_table
                (&enumDecls.
                  super_flat_hash_set<const_slang::syntax::SyntaxNode_*,_std::hash<const_SyntaxNode_*>,_std::equal_to<const_SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                  .
                  super_sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                );
      DeferredMemberData::~DeferredMemberData(&deferredData);
      return;
    }
    pSVar34 = *ppSVar33;
    LVar42 = LookupLocation::before(pSVar34);
    lookupLocation._8_8_ = LVar42._8_8_ & 0xffffffff;
    lookupLocation.scope = LVar42.scope;
    ASTContext::ASTContext(&context_1,this,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
    Symbol::as<(anonymous_namespace)::DeferredMemberSymbol>(pSVar34);
    pSVar3 = *(SyntaxNode **)(pSVar34 + 1);
    SVar2 = pSVar3->kind;
    if (SVar2 == AnsiPortList) {
LAB_0022ada0:
      context.scope.ptr = (Scope *)&context.instanceOrProc;
      context.lookupIndex = 0;
      context._12_4_ = 0;
      context.flags.m_bits = 5;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer._0_8_ =
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer + 0x18;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[8] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[9] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[10] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xb] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xc] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xd] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xe] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xf] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x10] = '\x04';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x11] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x12] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x13] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x14] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x15] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x16] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x17] = '\0';
      this_01 = (PortSymbol *)slang::syntax::SyntaxNode::as<slang::syntax::PortListSyntax>(pSVar3);
      portDeclarations.size_._0_4_ = uVar45;
      portDeclarations.data_ = (pointer)in_stack_fffffffffffffcd8;
      portDeclarations.size_._4_4_ = uVar46;
      PortSymbol::fromSyntax
                (this_01,(PortListSyntax *)this,(Scope *)&context,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls,
                 (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                 deferredData.portDecls.
                 super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,portDeclarations);
      const::$_1::operator()
                (&insertMembers,(SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context,pSVar34);
      puVar38 = (undefined8 *)
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer._0_8_;
      for (lVar31 = observedForwardDecls.
                    super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                    .buffer._8_8_ << 4; lVar31 != 0; lVar31 = lVar31 + -0x10) {
        insertMember(this,(Symbol *)*puVar38,(Symbol *)puVar38[1],true,false);
        puVar38 = puVar38 + 2;
      }
      pIVar21 = Symbol::as<slang::ast::InstanceBodySymbol>(this->thisSym);
      iVar15 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                         ((SmallVectorBase<const_slang::ast::Symbol_*> *)&context,
                          (EVP_PKEY_CTX *)this->compilation,src);
      (pIVar21->portList).data_ = (pointer)CONCAT44(extraout_var,iVar15);
      (pIVar21->portList).size_ = extraout_RDX;
      SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::
      ~SmallVectorBase((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                        *)&observedForwardDecls);
      SmallVectorBase<const_slang::ast::Symbol_*>::~SmallVectorBase
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)&context);
      bVar13 = true;
    }
    else if (SVar2 == BindDirective) {
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::BindDirectiveSyntax>(pSVar3);
      InstanceSymbol::fromBindDirective(this,syntax_00);
    }
    else if (SVar2 == CaseGenerate) {
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer._0_8_ =
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer + 0x18;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[8] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[9] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[10] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xb] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xc] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xd] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xe] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xf] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x10] = '\x05';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x11] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x12] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x13] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x14] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x15] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x16] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x17] = '\0';
      pCVar4 = this->compilation;
      syntax_10 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(pSVar3);
      GenerateBlockSymbol::fromSyntax
                (pCVar4,syntax_10,&context_1,constructIndex,true,
                 (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)&observedForwardDecls);
      const::$_1::operator()
                (&insertMembers,
                 (SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)&observedForwardDecls,
                 pSVar34);
LAB_0022b341:
      SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::~SmallVectorBase
                ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)&observedForwardDecls);
      constructIndex = constructIndex + 1;
    }
    else if (SVar2 == ClockingItem) {
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer._0_8_ =
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer + 0x18;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[8] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[9] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[10] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xb] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xc] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xd] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xe] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xf] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x10] = '\x05';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x11] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x12] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x13] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x14] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x15] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x16] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x17] = '\0';
      syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ClockingItemSyntax>(pSVar3);
      ClockVarSymbol::fromSyntax
                (this,syntax_01,
                 (SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *)&observedForwardDecls);
      uVar11 = observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer._0_8_;
      aVar10 = insertMembers;
      pSVar34->indexInScope =
           pSVar34->indexInScope -
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer._8_4_;
      lVar31 = observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer._8_8_ << 3;
      uVar45 = constructIndex;
      for (lVar36 = 0; lVar31 != lVar36; lVar36 = lVar36 + 8) {
        pSVar28 = *(Symbol **)(uVar11 + lVar36);
        insertMember(aVar10.this,pSVar28,pSVar34,true,true);
        pSVar34 = pSVar28;
      }
      SmallVectorBase<const_slang::ast::ClockVarSymbol_*>::~SmallVectorBase
                ((SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *)&observedForwardDecls);
      constructIndex = uVar45;
    }
    else if (SVar2 == ContinuousAssign) {
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer._0_8_ =
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer + 0x18;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[8] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[9] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[10] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xb] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xc] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xd] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xe] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xf] = '\0';
      context.scope.ptr = (Scope *)&context.instanceOrProc;
      context.lookupIndex = 0;
      context._12_4_ = 0;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x10] = '\x05';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x11] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x12] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x13] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x14] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x15] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x16] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x17] = '\0';
      context.flags.m_bits = 5;
      pCVar4 = this->compilation;
      syntax_07 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>(pSVar3);
      ContinuousAssignSymbol::fromSyntax
                (pCVar4,syntax_07,&context_1,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls,
                 (SmallVectorBase<const_slang::ast::Symbol_*> *)&context);
      const::$_0::operator()
                ((__0 *)&insertMembersAndNets,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&observedForwardDecls,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context,pSVar34);
LAB_0022b1af:
      SmallVectorBase<const_slang::ast::Symbol_*>::~SmallVectorBase
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)&context);
      SmallVectorBase<const_slang::ast::Symbol_*>::~SmallVectorBase
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls);
      uVar45 = constructIndex;
    }
    else if (SVar2 == DataDeclaration) {
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer._0_8_ =
           observedForwardDecls.
           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
           .buffer + 0x18;
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[8] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[9] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[10] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xb] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xc] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xd] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xe] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0xf] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x10] = '\x05';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x11] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x12] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x13] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x14] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x15] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x16] = '\0';
      observedForwardDecls.
      super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
      .buffer[0x17] = '\0';
      pDVar24 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(pSVar3);
      tryFixupInstances(this,pDVar24,&context_1,
                        (SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls);
      const::$_1::operator()
                (&insertMembers,
                 (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&observedForwardDecls,pSVar34);
LAB_0022b265:
      SmallVectorBase<const_slang::ast::Symbol_*>::~SmallVectorBase
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls);
    }
    else if (SVar2 == DefaultClockingReference) {
      pCVar4 = this->compilation;
      syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultClockingReferenceSyntax>
                            (pSVar3);
      Compilation::noteDefaultClocking(pCVar4,&context_1,syntax_03);
    }
    else if (SVar2 == DefaultDisableDeclaration) {
      pDVar22 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultDisableDeclarationSyntax>
                          (pSVar3);
      pEVar23 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pDVar22->expr);
      iVar15 = Expression::bind((int)pEVar23,(sockaddr *)&context_1,0);
      expr = (Expression *)CONCAT44(extraout_var_00,iVar15);
      pTVar17 = not_null<const_slang::ast::Type_*>::get(&expr->type);
      bVar14 = Type::isVoid(pTVar17);
      if (!bVar14) {
        ASTContext::requireBooleanConvertible(&context_1,expr);
      }
      Compilation::noteDefaultDisable(this->compilation,this,expr);
    }
    else {
      if (SVar2 == GenerateBlock) {
        syntax_06 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(pSVar3);
        member_00 = GenerateBlockSymbol::fromSyntax(this,syntax_06,constructIndex);
        insertMember(this,&member_00->super_Symbol,pSVar34,true,true);
      }
      else {
        if (SVar2 == HierarchyInstantiation) {
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer._0_8_ =
               observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer + 0x18;
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[8] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[9] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[10] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xb] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xc] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xd] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xe] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xf] = '\0';
          context.scope.ptr = (Scope *)&context.instanceOrProc;
          context.lookupIndex = 0;
          context._12_4_ = 0;
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x10] = '\x05';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x11] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x12] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x13] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x14] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x15] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x16] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x17] = '\0';
          context.flags.m_bits = 5;
          pCVar4 = this->compilation;
          syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>
                                (pSVar3);
          InstanceSymbol::fromSyntax
                    (pCVar4,syntax_02,&context_1,
                     (SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls,
                     (SmallVectorBase<const_slang::ast::Symbol_*> *)&context);
          const::$_0::operator()
                    ((__0 *)&insertMembersAndNets,
                     (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&observedForwardDecls,
                     (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context,pSVar34);
          goto LAB_0022b1af;
        }
        if (SVar2 == IfGenerate) {
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer._0_8_ =
               observedForwardDecls.
               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               .buffer + 0x18;
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[8] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[9] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[10] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xb] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xc] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xd] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xe] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0xf] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x10] = '\x05';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x11] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x12] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x13] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x14] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x15] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x16] = '\0';
          observedForwardDecls.
          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
          .buffer[0x17] = '\0';
          pCVar4 = this->compilation;
          syntax_08 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(pSVar3);
          GenerateBlockSymbol::fromSyntax
                    (pCVar4,syntax_08,&context_1,constructIndex,true,
                     (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)&observedForwardDecls);
          const::$_1::operator()
                    (&insertMembers,
                     (SmallVector<slang::ast::GenerateBlockSymbol_*,_5UL> *)&observedForwardDecls,
                     pSVar34);
          goto LAB_0022b341;
        }
        if (SVar2 != LoopGenerate) {
          if (SVar2 == ModportDeclaration) {
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer._0_8_ =
                 observedForwardDecls.
                 super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                 .buffer + 0x18;
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[8] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[9] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[10] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0xb] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0xc] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0xd] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0xe] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0xf] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x10] = '\x05';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x11] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x12] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x13] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x14] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x15] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x16] = '\0';
            observedForwardDecls.
            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
            .buffer[0x17] = '\0';
            syntax_09 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                                  (pSVar3);
            ModportSymbol::fromSyntax
                      (&context_1,syntax_09,
                       (SmallVectorBase<const_slang::ast::ModportSymbol_*> *)&observedForwardDecls);
            uVar11 = observedForwardDecls.
                     super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                     .buffer._0_8_;
            aVar10 = insertMembers;
            pSVar34->indexInScope =
                 pSVar34->indexInScope -
                 observedForwardDecls.
                 super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                 .buffer._8_4_;
            lVar31 = observedForwardDecls.
                     super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                     .buffer._8_8_ << 3;
            for (lVar36 = 0; lVar31 != lVar36; lVar36 = lVar36 + 8) {
              pSVar28 = *(Symbol **)(uVar11 + lVar36);
              insertMember(aVar10.this,pSVar28,pSVar34,true,true);
              pSVar34 = pSVar28;
            }
            SmallVectorBase<const_slang::ast::ModportSymbol_*>::~SmallVectorBase
                      ((SmallVectorBase<const_slang::ast::ModportSymbol_*> *)&observedForwardDecls);
            uVar45 = constructIndex;
          }
          else {
            if (SVar2 != ModuleDeclaration) {
              if (SVar2 == NonAnsiPortList) goto LAB_0022ada0;
              if (SVar2 == PortDeclaration) goto LAB_0022b374;
              if (SVar2 == PrimitiveInstantiation) {
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer._0_8_ =
                     observedForwardDecls.
                     super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                     .buffer + 0x18;
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[8] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[9] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[10] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0xb] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0xc] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0xd] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0xe] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0xf] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x10] = '\x05';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x11] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x12] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x13] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x14] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x15] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x16] = '\0';
                observedForwardDecls.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
                .buffer[0x17] = '\0';
                context.scope.ptr = (Scope *)&context.instanceOrProc;
                context.lookupIndex = 0;
                context._12_4_ = 0;
                context.flags.m_bits = 5;
                syntax_05 = slang::syntax::SyntaxNode::
                            as<slang::syntax::PrimitiveInstantiationSyntax>(pSVar3);
                PrimitiveInstanceSymbol::fromSyntax
                          (syntax_05,&context_1,
                           (SmallVectorBase<const_slang::ast::Symbol_*> *)&observedForwardDecls,
                           (SmallVectorBase<const_slang::ast::Symbol_*> *)&context);
                const::$_0::operator()
                          ((__0 *)&insertMembersAndNets,
                           (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&observedForwardDecls,
                           (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context,pSVar34);
                SmallVectorBase<const_slang::ast::Symbol_*>::~SmallVectorBase
                          ((SmallVectorBase<const_slang::ast::Symbol_*> *)&context);
                goto LAB_0022b265;
              }
              if (SVar2 != ProgramDeclaration) {
                this_06 = (logic_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_140,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                           ,&local_309);
                std::operator+(&local_120,&local_140,":");
                std::__cxx11::to_string(&local_160,0x400);
                std::operator+(&local_100,&local_120,&local_160);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &context,&local_100,": ");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &observedForwardDecls,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &context,"Default case should be unreachable!");
                std::logic_error::logic_error(this_06,(string *)&observedForwardDecls);
                __cxa_throw(this_06,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
            bVar12 = true;
          }
          goto LAB_0022b374;
        }
        pCVar4 = this->compilation;
        syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::LoopGenerateSyntax>(pSVar3);
        member = GenerateBlockArraySymbol::fromSyntax
                           (pCVar4,syntax_04,pSVar34->indexInScope,&context_1,constructIndex);
        insertMember(this,&member->super_Symbol,pSVar34,true,true);
      }
      constructIndex = constructIndex + 1;
    }
LAB_0022b374:
    ppSVar33 = ppSVar33 + 1;
  } while( true );
}

Assistant:

void Scope::elaborate() const {
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled()) {
        TimeTrace::beginTrace("elaborate scope"sv, [&] {
            std::string buffer;
            thisSym->getHierarchicalPath(buffer);
            return buffer;
        });
    }

    ASSERT(deferredMemberIndex != DeferredMemberIndex::Invalid);
    auto deferredData = compilation.getOrAddDeferredData(deferredMemberIndex);
    deferredMemberIndex = DeferredMemberIndex::Invalid;

    SmallSet<const SyntaxNode*, 8> enumDecls;
    for (const auto& pair : deferredData.getTransparentTypes()) {
        auto insertAt = pair.first;
        auto dt = pair.second->getDeclaredType();

        const Type* type = &dt->getType();
        while (type->isPackedArray())
            type = type->getArrayElementType();

        if (type->kind == SymbolKind::EnumType) {
            if (!type->getSyntax() || enumDecls.insert(type->getSyntax()).second) {
                for (const auto& value : type->as<EnumType>().values()) {
                    auto wrapped = compilation.emplace<TransparentMemberSymbol>(value);
                    insertMember(wrapped, insertAt, true, false);
                    insertAt = wrapped;
                }
            }
        }
        else {
            // If there was an error with the enum definition, we still want to
            // add all of the members into this scope so that we don't get
            // further errors reported.
            auto syntax = dt->getTypeSyntax();
            ASSERT(syntax);
            ASSERT(type->kind == SymbolKind::ErrorType);

            SmallVector<const Symbol*> members;
            ASTContext context(*this, LookupLocation::max);
            EnumType::createDefaultMembers(context, syntax->as<EnumTypeSyntax>(), members);

            for (auto member : members) {
                insertMember(member, insertAt, true, false);
                insertAt = member;
            }
        }
    }

    auto deferred = deferredData.getMembers();

    if (thisSym->kind == SymbolKind::ClassType) {
        // If this is a class type being elaborated, let it inherit members from parent classes.
        thisSym->as<ClassType>().inheritMembers(
            [this](const Symbol& member) { insertMember(&member, nullptr, true, true); });
    }
    else if (thisSym->kind == SymbolKind::InstanceBody &&
             thisSym->as<InstanceBodySymbol>().getDefinition().definitionKind ==
                 DefinitionKind::Interface) {
        // Allow the interface to implicitly declare extern methods for
        // exported subroutines that are only declared in modports.
        handleExportedMethods(deferred);
    }

    auto insertMembers = [this](auto& members, const Symbol* at) {
        // When we originally inserted the DeferredMemberSymbol we made room
        // in the index space for these new members. Back the index up by
        // the number of new members to make sure we insert in order.
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size();
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    auto insertMembersAndNets = [this](auto& members, auto& implicitNets, const Symbol* at) {
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size() + 1;
        for (auto net : implicitNets) {
            insertMember(net, at, true, false);
            at = net;
        }

        at->indexInScope += 1;
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    // Go through deferred instances and elaborate them now.
    bool usedPorts = false;
    bool hasNestedDefs = false;
    uint32_t constructIndex = 1;

    for (auto symbol : deferred) {
        ASTContext context(*this, LookupLocation::before(*symbol));
        auto& member = symbol->as<DeferredMemberSymbol>();

        switch (member.node.kind) {
            case SyntaxKind::HierarchyInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                InstanceSymbol::fromSyntax(compilation,
                                           member.node.as<HierarchyInstantiationSyntax>(), context,
                                           instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::PrimitiveInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                PrimitiveInstanceSymbol::fromSyntax(member.node.as<PrimitiveInstantiationSyntax>(),
                                                    context, instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::IfGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<IfGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::CaseGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<CaseGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::LoopGenerate:
                insertMember(&GenerateBlockArraySymbol::fromSyntax(
                                 compilation, member.node.as<LoopGenerateSyntax>(),
                                 symbol->getIndex(), context, constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::GenerateBlock:
                // This case is invalid according to the spec but the parser only issues a warning
                // since some existing code does this anyway.
                insertMember(&GenerateBlockSymbol::fromSyntax(
                                 *this, member.node.as<GenerateBlockSyntax>(), constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::AnsiPortList:
            case SyntaxKind::NonAnsiPortList: {
                SmallVector<const Symbol*> ports;
                SmallVector<std::pair<Symbol*, const Symbol*>, 4> implicitMembers;
                PortSymbol::fromSyntax(member.node.as<PortListSyntax>(), *this, ports,
                                       implicitMembers, deferredData.getPortDeclarations());
                insertMembers(ports, symbol);

                for (auto [implicitMember, insertionPoint] : implicitMembers)
                    insertMember(implicitMember, insertionPoint, true, false);

                // Let the instance know its list of ports. This is kind of annoying because it
                // inverts the dependency tree but it's better than giving all symbols a virtual
                // method just for this.
                asSymbol().as<InstanceBodySymbol>().setPorts(ports.copy(compilation));
                usedPorts = true;
                break;
            }
            case SyntaxKind::ContinuousAssign: {
                SmallVector<const Symbol*> symbols;
                SmallVector<const Symbol*> implicitNets;
                ContinuousAssignSymbol::fromSyntax(compilation,
                                                   member.node.as<ContinuousAssignSyntax>(),
                                                   context, symbols, implicitNets);
                insertMembersAndNets(symbols, implicitNets, symbol);
                break;
            }
            case SyntaxKind::ModportDeclaration: {
                SmallVector<const ModportSymbol*> results;
                ModportSymbol::fromSyntax(context, member.node.as<ModportDeclarationSyntax>(),
                                          results);
                insertMembers(results, symbol);
                break;
            }
            case SyntaxKind::BindDirective:
                InstanceSymbol::fromBindDirective(*this, member.node.as<BindDirectiveSyntax>());
                break;
            case SyntaxKind::ClockingItem: {
                SmallVector<const ClockVarSymbol*> vars;
                ClockVarSymbol::fromSyntax(*this, member.node.as<ClockingItemSyntax>(), vars);
                insertMembers(vars, symbol);
                break;
            }
            case SyntaxKind::DefaultClockingReference: {
                // No symbol to create here; instead, try to look up the clocking block
                // and register it as a default.
                compilation.noteDefaultClocking(context,
                                                member.node.as<DefaultClockingReferenceSyntax>());
                break;
            }
            case SyntaxKind::DefaultDisableDeclaration: {
                // No symbol to create here; instead, bind the expression and hand it
                // off to the compilation for tracking.
                auto& expr = Expression::bind(
                    *member.node.as<DefaultDisableDeclarationSyntax>().expr, context);

                if (!expr.type->isVoid())
                    context.requireBooleanConvertible(expr);

                compilation.noteDefaultDisable(*this, expr);
                break;
            }
            case SyntaxKind::PortDeclaration:
                // Nothing to do here, handled by port creation.
                break;
            case SyntaxKind::DataDeclaration: {
                SmallVector<const Symbol*> instances;
                tryFixupInstances(member.node.as<DataDeclarationSyntax>(), context, instances);
                insertMembers(instances, symbol);
                break;
            }
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::ProgramDeclaration:
                // These have to wait until we've seen all instantiations.
                hasNestedDefs = true;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    // If there are nested definitions, go back through and find ones that
    // need to be implicitly instantiated.
    if (hasNestedDefs) {
        for (auto symbol : deferred) {
            auto& member = symbol->as<DeferredMemberSymbol>();
            if (member.node.kind == SyntaxKind::ModuleDeclaration ||
                member.node.kind == SyntaxKind::ProgramDeclaration) {
                handleNestedDefinition(member.node.as<ModuleDeclarationSyntax>());
            }
        }
    }

    // Issue an error if port I/Os were declared but the module doesn't have a port list.
    if (!usedPorts) {
        for (auto [syntax, symbol] : deferredData.getPortDeclarations()) {
            auto& declarators = syntax->kind == SyntaxKind::PortDeclaration
                                    ? syntax->as<PortDeclarationSyntax>().declarators
                                    : syntax->as<DataDeclarationSyntax>().declarators;
            for (auto decl : declarators) {
                // We'll report an error for just the first decl in each syntax entry,
                // because it should be clear to the user that there aren't any ports
                // at all in the module header.
                auto name = decl->name.valueText();
                if (!name.empty()) {
                    addDiag(diag::UnusedPortDecl, decl->sourceRange()) << name;
                    break;
                }
            }
        }
    }

    // Finally unlink any deferred members we had; we no longer need them.
    if (!deferred.empty()) {
        const Symbol* symbol = firstMember;
        const Symbol* prev = nullptr;

        while (symbol) {
            if (symbol->kind == SymbolKind::DeferredMember) {
                if (prev)
                    prev->nextInScope = symbol->nextInScope;
                else
                    firstMember = symbol->nextInScope;

                if (lastMember == symbol)
                    lastMember = symbol->nextInScope;
            }
            else {
                prev = symbol;
            }
            symbol = symbol->nextInScope;
        }
    }

    SmallSet<string_view, 4> observedForwardDecls;
    for (auto symbol : deferredData.getForwardingTypedefs()) {
        // Ignore duplicate entries.
        if (symbol->name.empty() || !observedForwardDecls.emplace(symbol->name).second)
            continue;

        // Try to do a lookup by name; if the program is well-formed we'll find the
        // corresponding full typedef. If we don't, issue an error.
        auto it = nameMap->find(symbol->name);
        ASSERT(it != nameMap->end());

        if (it->second->kind == SymbolKind::TypeAlias)
            it->second->as<TypeAliasType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::ClassType)
            it->second->as<ClassType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::GenericClassDef)
            it->second->as<GenericClassDefSymbol>().checkForwardDecls();
        else
            addDiag(diag::UnresolvedForwardTypedef, symbol->location) << symbol->name;
    }

    // Allow statement blocks containing variables to include them in their member
    // list before allowing anyone else to access the contained statements.
    if (thisSym->kind == SymbolKind::StatementBlock) {
        const Symbol* at = nullptr;
        thisSym->as<StatementBlockSymbol>().elaborateVariables([this, &at](const Symbol& member) {
            insertMember(&member, at, true, false);
            at = &member;
        });
    }

    ASSERT(deferredMemberIndex == DeferredMemberIndex::Invalid);
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled())
        TimeTrace::endTrace();
}